

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

void calc_mean_and_sd_weighted<float,std::vector<double,std::allocator<double>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,float *x,
               vector<double,_std::allocator<double>_> *w,MissingAction missing_action,double *x_sd,
               double *x_mean)

{
  pointer pdVar1;
  size_t row;
  longdouble in_ST0;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  double dVar6;
  long local_a8;
  ushort uStack_a0;
  long local_98;
  ushort uStack_90;
  
  do {
    lVar2 = (longdouble)x[ix_arr[st]];
    if (NAN(x[ix_arr[st]])) {
      if (end < st) {
LAB_00287dcc:
        lVar2 = (longdouble)NAN;
        dVar6 = 0.0;
        if (st <= end) {
          pdVar1 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar2 = (longdouble)0;
          lVar4 = lVar2;
          lVar5 = lVar2;
          do {
            lVar3 = (longdouble)x[ix_arr[st]];
            local_a8 = SUB108(lVar3,0);
            uStack_a0 = (ushort)((unkuint10)lVar3 >> 0x40);
            if ((!NAN(x[ix_arr[st]])) &&
               ((~uStack_a0 & 0x7fff) != 0 || local_a8 != -0x8000000000000000)) {
              lVar5 = lVar5 + (longdouble)pdVar1[ix_arr[st]];
              lVar2 = in_ST0;
              lVar3 = in_ST0;
              fmal();
              fmal();
              lVar4 = in_ST0;
              in_ST0 = lVar3;
            }
            st = st + 1;
          } while (st <= end);
          dVar6 = (double)lVar4;
          lVar2 = lVar2 / lVar5;
        }
        *x_mean = dVar6;
        *x_sd = (double)SQRT(lVar2);
        return;
      }
    }
    else {
      local_98 = SUB108(lVar2,0);
      uStack_90 = (ushort)((unkuint10)lVar2 >> 0x40);
      if ((end < st) || ((~uStack_90 & 0x7fff) != 0 || local_98 != -0x8000000000000000))
      goto LAB_00287dcc;
    }
    st = st + 1;
  } while( true );
}

Assistant:

void calc_mean_and_sd_weighted(size_t ix_arr[], size_t st, size_t end, real_t_ *restrict x, mapping &restrict w,
                               MissingAction missing_action, double &restrict x_sd, double &restrict x_mean)
{
    ldouble_safe cnt = 0;
    ldouble_safe w_this;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = x[ix_arr[st]];
    ldouble_safe xval;
    while (is_na_or_inf(m_prev) && st <= end)
    {
        m_prev = x[ix_arr[++st]];
    }

    for (size_t row = st; row <= end; row++)
    {
        xval = x[ix_arr[row]];
        if (likely(!is_na_or_inf(xval)))
        {
            w_this = w[ix_arr[row]];
            cnt += w_this;
            m = std::fma(w_this, (xval - m) / cnt, m);
            s = std::fma(w_this, (xval - m) * (xval - m_prev), s);
            m_prev = m;
        }
    }

    x_mean = m;
    x_sd   = std::sqrt((ldouble_safe)s / (ldouble_safe)cnt);
}